

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O1

int __thiscall
TGenericArray<unsigned_int>::LoadFromStream(TGenericArray<unsigned_int> *this,TByteStream *InStream)

{
  ulong *puVar1;
  int iVar2;
  ulong unaff_R15;
  ulong uVar3;
  
  if (InStream->cbByteData < 8) {
    iVar2 = 1000;
  }
  else {
    puVar1 = (ulong *)InStream->pbByteData;
    InStream->pbByteData = (LPBYTE)(puVar1 + 1);
    InStream->cbByteData = InStream->cbByteData - 8;
    unaff_R15 = *puVar1;
    iVar2 = 0;
  }
  if (iVar2 == 0) {
    iVar2 = 0;
    if ((unaff_R15 & 0xffffffff00000003) == 0) {
      this->ItemCount = (DWORD)(unaff_R15 >> 2);
      goto LAB_00119046;
    }
    iVar2 = 1000;
  }
  unaff_R15 = 0;
LAB_00119046:
  if ((iVar2 == 0) &&
     (iVar2 = TByteStream::GetArray<unsigned_int>(InStream,&this->ItemArray,(ulong)this->ItemCount),
     iVar2 == 0)) {
    uVar3 = (ulong)(-(int)unaff_R15 & 4);
    iVar2 = 1000;
    if (uVar3 <= InStream->cbByteData) {
      InStream->pbByteData = InStream->pbByteData + uVar3;
      InStream->cbByteData = InStream->cbByteData - uVar3;
      iVar2 = 0x11;
      if (this->bIsValidArray == false) {
        this->bIsValidArray = true;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int LoadFromStream(TByteStream & InStream)
    {
        DWORD NumberOfBytes;
        int nError;

        // Get and verify the number of items
        nError = InStream.GetArrayItemCount<T>(NumberOfBytes, ItemCount);
        if(nError != ERROR_SUCCESS)
            return nError;

        // Get the pointer to the array
        nError = InStream.GetArray<T>(&ItemArray, ItemCount);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = InStream.SkipBytes((0 - (DWORD)NumberOfBytes) & 0x07);
        if(nError != ERROR_SUCCESS)
            return nError;

        return SetArrayValid();
    }